

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O0

int ddExtSymmCheck(DdManager *table,int x,int y)

{
  DdHalfWord y_00;
  int iVar1;
  bool bVar2;
  DdNode *sentinel;
  DdNodePtr *list;
  int slots;
  int res;
  int yindex;
  int xindex;
  int i;
  int arccounter;
  int counter;
  int TotalRefCount;
  int arccount;
  int notproj;
  uint comple;
  DdNode *one;
  DdNode *f10;
  DdNode *f11;
  DdNode *f00;
  DdNode *f01;
  DdNode *f1;
  DdNode *f0;
  DdNode *f;
  int y_local;
  int x_local;
  DdManager *table_local;
  
  y_00 = table->invperm[y];
  iVar1 = cuddTestInteract(table,table->invperm[x],y_00);
  if (iVar1 == 0) {
    table_local._4_4_ = 0;
  }
  else {
    counter = 0;
    i = (int)((double)table->subtables[x].keys * ((double)table->symmviolation / 100.0) + 0.5);
    for (yindex = 0; yindex < (int)table->subtables[x].slots; yindex = yindex + 1) {
      for (f0 = table->subtables[x].nodelist[yindex]; (DdManager *)f0 != table; f0 = f0->next) {
        one = (f0->type).kids.T;
        f11 = (DdNode *)((ulong)(f0->type).kids.E & 0xfffffffffffffffe);
        bVar2 = true;
        if ((one == table->one) && (bVar2 = true, f11 == table->one)) {
          bVar2 = f0->ref != 1;
        }
        if (one->index == y_00) {
          counter = counter + 1;
          f10 = (one->type).kids.T;
          one = (one->type).kids.E;
        }
        else {
          f10 = one;
          if ((f11->index != y_00) && (bVar2)) {
            if (i == 0) {
              return 0;
            }
            i = i + -1;
          }
        }
        f00 = f11;
        if (f11->index == y_00) {
          counter = counter + 1;
          f00 = (f11->type).kids.T;
          f11 = (f11->type).kids.E;
        }
        if (((ulong)(f0->type).kids.E & 1) != 0) {
          f00 = (DdNode *)((ulong)f00 ^ 1);
          f11 = (DdNode *)((ulong)f11 ^ 1);
        }
        if (((bVar2) && (f00 != one)) && (f10 != f11)) {
          if (i == 0) {
            return 0;
          }
          i = i + -1;
        }
      }
    }
    arccounter = -1;
    for (yindex = 0; yindex < (int)table->subtables[y].slots; yindex = yindex + 1) {
      for (f0 = table->subtables[y].nodelist[yindex]; (DdManager *)f0 != table; f0 = f0->next) {
        arccounter = f0->ref + arccounter;
      }
    }
    table_local._4_4_ =
         (uint)(arccounter -
                (int)((double)table->subtables[y].keys * ((double)table->arcviolation / 100.0) + 0.5
                     ) <= counter);
  }
  return table_local._4_4_;
}

Assistant:

static int
ddExtSymmCheck(
  DdManager * table,
  int  x,
  int  y)
{
    DdNode *f,*f0,*f1,*f01,*f00,*f11,*f10;
    DdNode *one;
    unsigned comple;    /* f0 is complemented */
    int notproj;        /* f is not a projection function */
    int arccount;       /* number of arcs from layer x to layer y */
    int TotalRefCount;  /* total reference count of layer y minus 1 */
    int counter;        /* number of nodes of layer x that are allowed */
                        /* to violate extended symmetry conditions */
    int arccounter;     /* number of arcs into layer y that are allowed */
                        /* to come from layers other than x */
    int i;
    int xindex;
    int yindex;
    int res;
    int slots;
    DdNodePtr *list;
    DdNode *sentinel = &(table->sentinel);

    xindex = table->invperm[x];
    yindex = table->invperm[y];

    /* If the two variables do not interact, we do not want to merge them. */
    if (!cuddTestInteract(table,xindex,yindex))
        return(0);

#ifdef DD_DEBUG
    /* Checks that x and y do not contain just the projection functions.
    ** With the test on interaction, these test become redundant,
    ** because an isolated projection function does not interact with
    ** any other variable.
    */
    if (table->subtables[x].keys == 1) {
        assert(table->vars[xindex]->ref != 1);
    }
    if (table->subtables[y].keys == 1) {
        assert(table->vars[yindex]->ref != 1);
    }
#endif

#ifdef DD_STATS
    extsymmcalls++;
#endif

    arccount = 0;
    counter = (int) (table->subtables[x].keys *
              (table->symmviolation/100.0) + 0.5);
    one = DD_ONE(table);

    slots = table->subtables[x].slots;
    list = table->subtables[x].nodelist;
    for (i = 0; i < slots; i++) {
        f = list[i];
        while (f != sentinel) {
            /* Find f1, f0, f11, f10, f01, f00. */
            f1 = cuddT(f);
            f0 = Cudd_Regular(cuddE(f));
            comple = Cudd_IsComplement(cuddE(f));
            notproj = f1 != one || f0 != one || f->ref != (DdHalfWord) 1;
            if (f1->index == (unsigned) yindex) {
                arccount++;
                f11 = cuddT(f1); f10 = cuddE(f1);
            } else {
                if ((int) f0->index != yindex) {
                    /* If f is an isolated projection function it is
                    ** allowed to bypass layer y.
                    */
                    if (notproj) {
                        if (counter == 0)
                            return(0);
                        counter--; /* f bypasses layer y */
                    }
                }
                f11 = f10 = f1;
            }
            if ((int) f0->index == yindex) {
                arccount++;
                f01 = cuddT(f0); f00 = cuddE(f0);
            } else {
                f01 = f00 = f0;
            }
            if (comple) {
                f01 = Cudd_Not(f01);
                f00 = Cudd_Not(f00);
            }

            /* Unless we are looking at a projection function
            ** without external references except the one from the
            ** table, we insist that f01 == f10 or f11 == f00
            */
            if (notproj) {
                if (f01 != f10 && f11 != f00) {
                    if (counter == 0)
                        return(0);
                    counter--;
                }
            }

            f = f->next;
        } /* while */
    } /* for */

    /* Calculate the total reference counts of y */
    TotalRefCount = -1; /* -1 for projection function */
    slots = table->subtables[y].slots;
    list = table->subtables[y].nodelist;
    for (i = 0; i < slots; i++) {
        f = list[i];
        while (f != sentinel) {
            TotalRefCount += f->ref;
            f = f->next;
        }
    }

    arccounter = (int) (table->subtables[y].keys *
                 (table->arcviolation/100.0) + 0.5);
    res = arccount >= TotalRefCount - arccounter;

#if defined(DD_DEBUG) && defined(DD_VERBOSE)
    if (res) {
        (void) fprintf(table->out,
                       "Found extended symmetry! x = %d\ty = %d\tPos(%d,%d)\n",
                       xindex,yindex,x,y);
    }
#endif

#ifdef DD_STATS
    if (res)
        extsymm++;
#endif
    return(res);

}